

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::BaseRockSample(BaseRockSample *this,int size,int rocks)

{
  int rocks_local;
  int size_local;
  BaseRockSample *this_local;
  
  MDP::MDP(&this->super_MDP);
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  *(undefined ***)this = &PTR__BaseRockSample_00149400;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseRockSample_00149518;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseRockSample_00149620;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseRockSample_00149658;
  Grid<int>::Grid(&this->grid_,size,size);
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::vector(&this->rock_pos_);
  this->size_ = size;
  this->num_rocks_ = rocks;
  despot::Coord::Coord(&this->start_pos_);
  MemoryPool<despot::RockSampleState>::MemoryPool(&this->memory_pool_);
  std::vector<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>::vector
            (&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->alpha_vectors_);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&this->mdp_policy_);
  if ((size == 4) && (rocks == 4)) {
    Init_4_4(this);
  }
  else if ((size == 5) && (rocks == 5)) {
    Init_5_5(this);
  }
  else if ((size == 5) && (rocks == 7)) {
    Init_5_7(this);
  }
  else if ((size == 7) && (rocks == 8)) {
    Init_7_8(this);
  }
  else if ((size == 0xb) && (rocks == 0xb)) {
    Init_11_11(this);
  }
  else {
    InitGeneral(this);
  }
  return;
}

Assistant:

BaseRockSample::BaseRockSample(int size, int rocks) :
	grid_(size, size),
	size_(size),
	num_rocks_(rocks) {
	if (size == 4 && rocks == 4) {
		Init_4_4();
	} else if (size == 5 && rocks == 5) {
		Init_5_5();
	} else if (size == 5 && rocks == 7) {
		Init_5_7();
	} else if (size == 7 && rocks == 8) {
		Init_7_8();
	} else if (size == 11 && rocks == 11) {
		Init_11_11();
	} else {
		InitGeneral();
	}

	// InitStates();
}